

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_fence_wait(ma_fence *pFence)

{
  ma_uint32 mVar1;
  ma_result mVar2;
  
  if (pFence == (ma_fence *)0x0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    mVar2 = MA_SUCCESS;
    mVar1 = pFence->counter;
    while (mVar1 != 0) {
      ma_event_wait(&pFence->e);
      mVar1 = pFence->counter;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_fence_wait(ma_fence* pFence)
{
    if (pFence == NULL) {
        return MA_INVALID_ARGS;
    }

    for (;;) {
        ma_uint32 counter;

        counter = c89atomic_load_32(&pFence->counter);
        if (counter == 0) {
            /*
            Counter has hit zero. By the time we get here some other thread may have acquired the
            fence again, but that is where the caller needs to take care with how they se the fence.
            */
            return MA_SUCCESS;
        }

        /* Getting here means the counter is > 0. We'll need to wait for something to happen. */
        #ifndef MA_NO_THREADING
        {
            ma_result result;

            result = ma_event_wait(&pFence->e);
            if (result != MA_SUCCESS) {
                return result;
            }
        }
        #endif
    }

    /* Should never get here. */
    /*return MA_INVALID_OPERATION;*/
}